

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollisionPdu.cpp
# Opt level: O2

void __thiscall DIS::CollisionPdu::CollisionPdu(CollisionPdu *this)

{
  EntityInformationFamilyPdu::EntityInformationFamilyPdu(&this->super_EntityInformationFamilyPdu);
  (this->super_EntityInformationFamilyPdu).super_Pdu.super_PduSuperclass._vptr_PduSuperclass =
       (_func_int **)&PTR__CollisionPdu_001c0c80;
  EntityID::EntityID(&this->_issuingEntityID);
  EntityID::EntityID(&this->_collidingEntityID);
  EventIdentifier::EventIdentifier(&this->_eventID);
  this->_collisionType = '\0';
  this->_pad = '\0';
  Vector3Float::Vector3Float(&this->_velocity);
  this->_mass = 0.0;
  Vector3Float::Vector3Float(&this->_location);
  PduSuperclass::setPduType((PduSuperclass *)this,'\x04');
  PduSuperclass::setProtocolFamily((PduSuperclass *)this,'\x01');
  return;
}

Assistant:

CollisionPdu::CollisionPdu() : EntityInformationFamilyPdu(),
   _issuingEntityID(), 
   _collidingEntityID(), 
   _eventID(), 
   _collisionType(0), 
   _pad(0), 
   _velocity(), 
   _mass(0.0), 
   _location()
{
    setPduType( 4 );
    setProtocolFamily( 1 );
}